

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_util.cpp
# Opt level: O1

int duckdb_brotli::BrotliIsMostlyUTF8
              (uint8_t *data,size_t pos,size_t mask,size_t length,double min_fraction)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (length == 0) {
    dVar9 = 0.0;
  }
  else {
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar1 = uVar4 + pos & mask;
      uVar2 = (uint)data[uVar1];
      lVar5 = 1;
      if ((char)data[uVar1] < '\x01') {
        uVar6 = length - uVar4;
        if ((((uVar6 < 2) || ((uVar2 & 0xffffffe0) != 0xc0)) ||
            ((data[uVar1 + 1] & 0xffffffc0) != 0x80)) || (uVar7 = (uVar2 & 0x1f) << 6, uVar7 < 0x80)
           ) {
          if (((uVar6 < 3) || ((uVar2 & 0xfffffff0) != 0xe0)) ||
             (((data[uVar1 + 1] & 0xffffffc0) != 0x80 ||
              (((data[uVar1 + 2] & 0xc0) != 0x80 ||
               (uVar7 = (data[uVar1 + 1] & 0x3f) << 6 | (uVar2 & 0xf) << 0xc, uVar7 < 0x800)))))) {
            if ((3 < uVar6) &&
               (((((uVar2 & 0xfffffff8) == 0xf0 && ((data[uVar1 + 1] & 0xc0) == 0x80)) &&
                 ((data[uVar1 + 2] & 0xffffffc0) == 0x80)) &&
                ((data[uVar1 + 3] & 0xffffffc0) == 0x80)))) {
              uVar8 = (uVar2 & 7) * 0x40000;
              uVar7 = (data[uVar1 + 1] & 0x3f) * 0x1000;
              if ((uVar7 + uVar8) - 0x10000 < 0x100000) {
                uVar2 = data[uVar1 + 3] & 0x3f | (data[uVar1 + 2] & 0x3f) << 6 | uVar7 | uVar8;
                lVar5 = 4;
                goto LAB_01137bb0;
              }
            }
            uVar2 = uVar2 | 0x110000;
          }
          else {
            uVar2 = data[uVar1 + 2] & 0x3f | uVar7;
            lVar5 = 3;
          }
        }
        else {
          uVar2 = data[uVar1 + 1] & 0x3f | uVar7;
          lVar5 = 2;
        }
      }
LAB_01137bb0:
      uVar4 = uVar4 + lVar5;
      if (0x10ffff < uVar2) {
        lVar5 = 0;
      }
      lVar3 = lVar3 + lVar5;
    } while (uVar4 < length);
    auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar10._0_8_ = lVar3;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
  }
  auVar11._8_4_ = (int)(length >> 0x20);
  auVar11._0_8_ = length;
  auVar11._12_4_ = 0x45300000;
  return (int)(((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)length) - 4503599627370496.0)) * min_fraction <
              dVar9);
}

Assistant:

BROTLI_BOOL duckdb_brotli::BrotliIsMostlyUTF8(
    const uint8_t* data, const size_t pos, const size_t mask,
    const size_t length, const double min_fraction) {
  size_t size_utf8 = 0;
  size_t i = 0;
  while (i < length) {
    int symbol;
    size_t bytes_read =
        BrotliParseAsUTF8(&symbol, &data[(pos + i) & mask], length - i);
    i += bytes_read;
    if (symbol < 0x110000) size_utf8 += bytes_read;
  }
  return TO_BROTLI_BOOL((double)size_utf8 > min_fraction * (double)length);
}